

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TagDeclaration_StructOrUnion.h
# Opt level: O3

void __thiscall
psy::C::StructOrUnionDeclarationSymbol::~StructOrUnionDeclarationSymbol
          (StructOrUnionDeclarationSymbol *this)

{
  pointer ppMVar1;
  
  (this->super_TagDeclarationSymbol).super_TypeDeclarationSymbol.super_DeclarationSymbol.
  super_Symbol._vptr_Symbol = (_func_int **)&PTR__TagDeclarationSymbol_00520640;
  ppMVar1 = (this->super_TagDeclarationSymbol).membDecls_.
            super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppMVar1 != (pointer)0x0) {
    operator_delete(ppMVar1,(long)(this->super_TagDeclarationSymbol).membDecls_.
                                  super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppMVar1
                   );
  }
  TypeDeclarationSymbol::~TypeDeclarationSymbol((TypeDeclarationSymbol *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

class PSY_C_API StructOrUnionDeclarationSymbol : public TagDeclarationSymbol
{
public:
    using Fields = std::vector<const FieldDeclarationSymbol*>;

    //!@{
    /**
     * Cast \c this Symbol as a TagDeclarationSymbol.
     */
    virtual StructOrUnionDeclarationSymbol* asStructOrUnionDeclaration() override { return this; }
    virtual const StructOrUnionDeclarationSymbol* asStructOrUnionDeclaration() const override { return this; }
    //!@}

    /**
     * The \a fields of \c this StructOrUnionDeclarationSymbol.
     */
    Fields fields() const;

PSY_INTERNAL:
    PSY_GRANT_INTERNAL_ACCESS(DeclarationBinder);

    void addField(const FieldDeclarationSymbol* fld);

protected:
    StructOrUnionDeclarationSymbol(
            SymbolKind symK,
            const Symbol* containingSym,
            const SyntaxTree* tree,
            const Scope* enclosingScope,
            TagType* tagTy);
}